

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_show_colormap.cxx
# Opt level: O0

void __thiscall ColorMenu::draw(ColorMenu *this)

{
  uchar uVar1;
  int w;
  int h;
  Fl_Color c_00;
  Fl_Color local_14;
  int c;
  ColorMenu *this_local;
  
  uVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if (uVar1 == '\x01') {
    drawbox(this,this->previous);
    drawbox(this,this->which);
  }
  else {
    w = Fl_Widget::w((Fl_Widget *)this);
    h = Fl_Widget::h((Fl_Widget *)this);
    c_00 = Fl_Widget::color((Fl_Widget *)this);
    fl_draw_box(FL_UP_BOX,0,0,w,h,c_00);
    for (local_14 = 0; (int)local_14 < 0x100; local_14 = local_14 + 1) {
      drawbox(this,local_14);
    }
  }
  this->previous = this->which;
  return;
}

Assistant:

void ColorMenu::draw() {
  if (damage() != FL_DAMAGE_CHILD) {
    fl_draw_box(FL_UP_BOX,0,0,w(),h(),color());
    for (int c = 0; c < 256; c++) drawbox((Fl_Color)c);
  } else {
    drawbox(previous);
    drawbox(which);
  }
  previous = which;
}